

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

int __thiscall IsoWriter::mkdir(IsoWriter *this,char *__path,__mode_t __mode)

{
  uint8_t uVar1;
  FileEntryInfo *dir;
  undefined4 in_register_00000014;
  FileEntryInfo *this_00;
  allocator<char> local_49;
  long *local_48 [2];
  long local_38 [2];
  
  if (this->m_rootDirInfo == (FileEntryInfo *)0x0) {
    dir = (FileEntryInfo *)0x0;
  }
  else {
    this_00 = this->m_rootDirInfo;
    if ((FileEntryInfo *)CONCAT44(in_register_00000014,__mode) != (FileEntryInfo *)0x0) {
      this_00 = (FileEntryInfo *)CONCAT44(in_register_00000014,__mode);
    }
    dir = (FileEntryInfo *)operator_new(0xa8);
    uVar1 = this->m_objectUniqId;
    this->m_objectUniqId = uVar1 + '\x01';
    (dir->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (dir->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (dir->m_subDirs).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (dir->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (dir->m_subDirs).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (dir->m_subDirs).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    dir->m_owner = this;
    dir->m_parent = this_00;
    dir->m_sectorNum = 0;
    dir->m_sectorsUsed = 0;
    dir->m_objectId = uVar1;
    (dir->m_name)._M_dataplus._M_p = (pointer)&(dir->m_name).field_2;
    (dir->m_name)._M_string_length = 0;
    (dir->m_name).field_2._M_local_buf[0] = '\0';
    dir->m_fileType = Directory;
    (dir->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (dir->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (dir->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dir->m_fileSize = 0;
    *(undefined8 *)((long)&dir->m_fileSize + 5) = 0;
    *(undefined8 *)((long)&dir->m_sectorBuffer + 5) = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__path,&local_49);
    std::__cxx11::string::_M_assign((string *)&dir->m_name);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    FileEntryInfo::addSubDir(this_00,dir);
  }
  return (int)dir;
}

Assistant:

FileEntryInfo *IsoWriter::mkdir(const char *name, FileEntryInfo *parent)
{
    if (!m_rootDirInfo)
        return nullptr;
    if (parent == nullptr)
        parent = m_rootDirInfo;

    const auto dir = new FileEntryInfo(this, parent, m_objectUniqId++, FileTypes::Directory);
    dir->setName(name);
    parent->addSubDir(dir);
    // m_sectorNum += 2;
    // m_systemStreamLBN = m_sectorNum; // last allocated sector
    return dir;
}